

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDsdFilter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  If_DsdMan_t *p;
  If_DsdMan_t *pMan;
  char *pcVar5;
  uint local_58;
  uint local_54;
  int fVerbose;
  int fThreshHeuristic;
  int fThresh;
  int fUnate;
  int fInvMarks;
  int fCleanMarks;
  int fCleanOccur;
  int nLutSize;
  int nLimit;
  int c;
  If_DsdMan_t *pDsd;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p = (If_DsdMan_t *)Abc_FrameReadManDsd();
  fCleanOccur = 0;
  fCleanMarks = -1;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  fThreshHeuristic = 0;
  fVerbose = 0;
  local_54 = 0;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_00286014:
  iVar4 = Extra_UtilGetopt(argc,argv,"LKomiutsvh");
  if (iVar4 == -1) {
    if (p == (If_DsdMan_t *)0x0) {
      Abc_Print(-1,"The DSD manager is not started.\n");
    }
    else {
      if (0 < fCleanOccur) {
        pMan = If_DsdManFilter(p,fCleanOccur);
        Abc_FrameSetManDsd(pMan);
      }
      if (-1 < fCleanMarks) {
        If_DsdManSetLutSize(p,fCleanMarks);
      }
      if (bVar1) {
        If_DsdManCleanOccur(p,local_58);
      }
      if (bVar2) {
        If_DsdManCleanMarks(p,local_58);
      }
      if (bVar3) {
        If_DsdManInvertMarks(p,local_58);
      }
      else if (fCleanOccur == 0) {
        Id_DsdManTuneThresh(p,fThreshHeuristic,fVerbose,local_54,local_58);
      }
    }
    return 0;
  }
  switch(iVar4) {
  case 0x4b:
    if (globalUtilOptind < argc) {
      fCleanMarks = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00286014;
    }
    Abc_Print(-1,"Command line switch \"-K\" should be followed by a floating point number.\n");
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      fCleanOccur = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00286014;
    }
    Abc_Print(-1,"Command line switch \"-L\" should be followed by a floating point number.\n");
    break;
  default:
    break;
  case 0x68:
    break;
  case 0x69:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_00286014;
  case 0x6d:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_00286014;
  case 0x6f:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_00286014;
  case 0x73:
    local_54 = local_54 ^ 1;
    goto LAB_00286014;
  case 0x74:
    fVerbose = fVerbose ^ 1;
    goto LAB_00286014;
  case 0x75:
    fThreshHeuristic = fThreshHeuristic ^ 1;
    goto LAB_00286014;
  case 0x76:
    goto switchD_0028605a_caseD_76;
  }
  Abc_Print(-2,"usage: dsd_filter [-LK num] [-omiutsvh]\n");
  Abc_Print(-2,"\t         filtering structured and modifying parameters of DSD manager\n");
  Abc_Print(-2,"\t-L num : remove structures with fewer occurrences that this [default = %d]\n",
            (ulong)(uint)fCleanOccur);
  Abc_Print(-2,"\t-K num : new LUT size to set for the DSD manager [default = %d]\n",
            (ulong)(uint)fCleanMarks);
  pcVar5 = "no";
  if (bVar1) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-o     : toggles cleaning occurrence counters [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar2) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-m     : toggles cleaning matching marks [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (bVar3) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-i     : toggles inverting matching marks [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (fThreshHeuristic != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-u     : toggles marking unate functions [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (fVerbose != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-t     : toggles marking threshold functions [default = %s]\n",pcVar5);
  pcVar5 = "no";
  if (local_54 != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggles marking threshold functions heuristically [default = %s]\n",
            pcVar5);
  pcVar5 = "no";
  if (local_58 != 0) {
    pcVar5 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t        \n");
  Abc_Print(-2,
            "\t         Option \"dsd_filter -s\" was contributed by Augusto Neutzling and Jody Matos from\n"
           );
  Abc_Print(-2,
            "\t         Federal University of Rio Grande do Sul, Brazil. The paper describing the method:\n"
           );
  Abc_Print(-2,"\t         A. Neutzling, J. M. Matos, A. Mishchenko, R. Ribas, and A. Reis,\n");
  Abc_Print(-2,"\t         \"Threshold logic synthesis based on cut pruning\". Proc. ICCAD 2015.\n")
  ;
  return 1;
switchD_0028605a_caseD_76:
  local_58 = local_58 ^ 1;
  goto LAB_00286014;
}

Assistant:

int Abc_CommandDsdFilter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    If_DsdMan_t * pDsd = (If_DsdMan_t *)Abc_FrameReadManDsd();
    int c, nLimit = 0, nLutSize = -1, fCleanOccur = 0, fCleanMarks = 0, fInvMarks = 0, fUnate = 0, fThresh = 0, fThreshHeuristic = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "LKomiutsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a floating point number.\n" );
                goto usage;
            }
            nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a floating point number.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'o':
            fCleanOccur ^= 1;
            break;
        case 'm':
            fCleanMarks ^= 1;
            break;
        case 'i':
            fInvMarks ^= 1;
            break;
        case 'u':
            fUnate ^= 1;
            break;
        case 't':
            fThresh ^= 1;
            break;
        case 's':
            fThreshHeuristic ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pDsd == NULL )
    {
        Abc_Print( -1, "The DSD manager is not started.\n" );
        return 0;
    }
    if ( nLimit > 0 )
        Abc_FrameSetManDsd( If_DsdManFilter(pDsd, nLimit) );
    if ( nLutSize >= 0 )
        If_DsdManSetLutSize( pDsd, nLutSize );
    if ( fCleanOccur )
        If_DsdManCleanOccur( pDsd, fVerbose );
    if ( fCleanMarks )
        If_DsdManCleanMarks( pDsd, fVerbose );
    if ( fInvMarks )
        If_DsdManInvertMarks( pDsd, fVerbose );
#ifdef ABC_USE_CUDD
    else if ( nLimit == 0 )
        Id_DsdManTuneThresh( pDsd, fUnate, fThresh, fThreshHeuristic, fVerbose );
#endif
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_filter [-LK num] [-omiutsvh]\n" );
    Abc_Print( -2, "\t         filtering structured and modifying parameters of DSD manager\n" );
    Abc_Print( -2, "\t-L num : remove structures with fewer occurrences that this [default = %d]\n", nLimit );
    Abc_Print( -2, "\t-K num : new LUT size to set for the DSD manager [default = %d]\n",           nLutSize );
    Abc_Print( -2, "\t-o     : toggles cleaning occurrence counters [default = %s]\n",              fCleanOccur? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggles cleaning matching marks [default = %s]\n",                   fCleanMarks? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggles inverting matching marks [default = %s]\n",                  fInvMarks? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggles marking unate functions [default = %s]\n",                   fUnate? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggles marking threshold functions [default = %s]\n",               fThresh? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles marking threshold functions heuristically [default = %s]\n", fThreshHeuristic?"yes":"no");
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n",                            fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t        \n" );
    Abc_Print( -2, "\t         Option \"dsd_filter -s\" was contributed by Augusto Neutzling and Jody Matos from\n" );
    Abc_Print( -2, "\t         Federal University of Rio Grande do Sul, Brazil. The paper describing the method:\n" );
    Abc_Print( -2, "\t         A. Neutzling, J. M. Matos, A. Mishchenko, R. Ribas, and A. Reis,\n" );
    Abc_Print( -2, "\t         \"Threshold logic synthesis based on cut pruning\". Proc. ICCAD 2015.\n" );
//    Abc_Print( -2, "\t        http://www.eecs.berkeley.edu/~alanmi/publications/2015/iccad15_thresh.pdf\n" );
    return 1;
}